

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall crnlib::symbol_codec::arith_propagate_carry(symbol_codec *this)

{
  uchar *puVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->m_arith_output_buf).m_size;
  uVar3 = (ulong)uVar2;
  if (-1 < (int)(uVar2 - 1)) {
    do {
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      puVar1 = (this->m_arith_output_buf).m_p;
      if (puVar1[uVar3] != 0xff) {
        puVar1[uVar3] = puVar1[uVar3] + '\x01';
        return;
      }
      puVar1[uVar3] = '\0';
    } while (0 < (int)uVar2);
  }
  return;
}

Assistant:

inline uint size() const { return m_size; }